

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_4_3_compatibility.cpp
# Opt level: O1

bool __thiscall
QOpenGLFunctions_4_3_Compatibility::initializeOpenGLFunctions
          (QOpenGLFunctions_4_3_Compatibility *this)

{
  QAtomicInt *pQVar1;
  bool bVar2;
  QOpenGLContext *context;
  QOpenGLContext *pQVar3;
  QOpenGLFunctions_1_0_CoreBackend *pQVar4;
  QOpenGLFunctions_1_1_CoreBackend *pQVar5;
  QOpenGLFunctions_1_2_CoreBackend *pQVar6;
  QOpenGLFunctions_1_3_CoreBackend *pQVar7;
  QOpenGLFunctions_1_4_CoreBackend *pQVar8;
  QOpenGLFunctions_1_5_CoreBackend *pQVar9;
  QOpenGLFunctions_2_0_CoreBackend *pQVar10;
  QOpenGLFunctions_2_1_CoreBackend *pQVar11;
  QOpenGLFunctions_3_0_CoreBackend *pQVar12;
  QOpenGLFunctions_3_1_CoreBackend *pQVar13;
  QOpenGLFunctions_3_2_CoreBackend *pQVar14;
  QOpenGLFunctions_3_3_CoreBackend *pQVar15;
  QOpenGLFunctions_4_0_CoreBackend *pQVar16;
  QOpenGLFunctions_4_1_CoreBackend *pQVar17;
  QOpenGLFunctions_4_2_CoreBackend *pQVar18;
  QOpenGLFunctions_4_3_CoreBackend *pQVar19;
  QOpenGLFunctions_1_0_DeprecatedBackend *pQVar20;
  QOpenGLFunctions_1_1_DeprecatedBackend *pQVar21;
  QOpenGLFunctions_1_2_DeprecatedBackend *pQVar22;
  QOpenGLFunctions_1_3_DeprecatedBackend *pQVar23;
  QOpenGLFunctions_1_4_DeprecatedBackend *pQVar24;
  QOpenGLFunctions_3_3_DeprecatedBackend *pQVar25;
  
  bVar2 = QAbstractOpenGLFunctions::isInitialized(&this->super_QAbstractOpenGLFunctions);
  if (bVar2) {
    return true;
  }
  context = (QOpenGLContext *)QOpenGLContext::currentContext();
  pQVar3 = QAbstractOpenGLFunctions::owningContext(&this->super_QAbstractOpenGLFunctions);
  if (pQVar3 == (QOpenGLContext *)0x0) {
LAB_001711f6:
    pQVar3 = QAbstractOpenGLFunctions::owningContext(&this->super_QAbstractOpenGLFunctions);
    if (pQVar3 != (QOpenGLContext *)0x0) goto LAB_00171402;
  }
  else {
    pQVar3 = QAbstractOpenGLFunctions::owningContext(&this->super_QAbstractOpenGLFunctions);
    if (pQVar3 != context) goto LAB_001711f6;
  }
  bVar2 = isContextCompatible(context);
  if (bVar2) {
    pQVar4 = (QOpenGLFunctions_1_0_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_0_Core);
    this->d_1_0_Core = pQVar4;
    LOCK();
    pQVar1 = &(pQVar4->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar5 = (QOpenGLFunctions_1_1_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_1_Core);
    this->d_1_1_Core = pQVar5;
    LOCK();
    pQVar1 = &(pQVar5->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar6 = (QOpenGLFunctions_1_2_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_2_Core);
    this->d_1_2_Core = pQVar6;
    LOCK();
    pQVar1 = &(pQVar6->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar7 = (QOpenGLFunctions_1_3_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_3_Core);
    this->d_1_3_Core = pQVar7;
    LOCK();
    pQVar1 = &(pQVar7->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar8 = (QOpenGLFunctions_1_4_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_4_Core);
    this->d_1_4_Core = pQVar8;
    LOCK();
    pQVar1 = &(pQVar8->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar9 = (QOpenGLFunctions_1_5_CoreBackend *)
             QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_5_Core);
    this->d_1_5_Core = pQVar9;
    LOCK();
    pQVar1 = &(pQVar9->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar10 = (QOpenGLFunctions_2_0_CoreBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_2_0_Core);
    this->d_2_0_Core = pQVar10;
    LOCK();
    pQVar1 = &(pQVar10->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar11 = (QOpenGLFunctions_2_1_CoreBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_2_1_Core);
    this->d_2_1_Core = pQVar11;
    LOCK();
    pQVar1 = &(pQVar11->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar12 = (QOpenGLFunctions_3_0_CoreBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_3_0_Core);
    this->d_3_0_Core = pQVar12;
    LOCK();
    pQVar1 = &(pQVar12->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar13 = (QOpenGLFunctions_3_1_CoreBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_3_1_Core);
    this->d_3_1_Core = pQVar13;
    LOCK();
    pQVar1 = &(pQVar13->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar14 = (QOpenGLFunctions_3_2_CoreBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_3_2_Core);
    this->d_3_2_Core = pQVar14;
    LOCK();
    pQVar1 = &(pQVar14->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar15 = (QOpenGLFunctions_3_3_CoreBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_3_3_Core);
    this->d_3_3_Core = pQVar15;
    LOCK();
    pQVar1 = &(pQVar15->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar16 = (QOpenGLFunctions_4_0_CoreBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_4_0_Core);
    this->d_4_0_Core = pQVar16;
    LOCK();
    pQVar1 = &(pQVar16->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar17 = (QOpenGLFunctions_4_1_CoreBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_4_1_Core);
    this->d_4_1_Core = pQVar17;
    LOCK();
    pQVar1 = &(pQVar17->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar18 = (QOpenGLFunctions_4_2_CoreBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_4_2_Core);
    this->d_4_2_Core = pQVar18;
    LOCK();
    pQVar1 = &(pQVar18->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar19 = (QOpenGLFunctions_4_3_CoreBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_4_3_Core);
    this->d_4_3_Core = pQVar19;
    LOCK();
    pQVar1 = &(pQVar19->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar20 = (QOpenGLFunctions_1_0_DeprecatedBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_0_Deprecated);
    this->d_1_0_Deprecated = pQVar20;
    LOCK();
    pQVar1 = &(pQVar20->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar21 = (QOpenGLFunctions_1_1_DeprecatedBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_1_Deprecated);
    this->d_1_1_Deprecated = pQVar21;
    LOCK();
    pQVar1 = &(pQVar21->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar22 = (QOpenGLFunctions_1_2_DeprecatedBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_2_Deprecated);
    this->d_1_2_Deprecated = pQVar22;
    LOCK();
    pQVar1 = &(pQVar22->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar23 = (QOpenGLFunctions_1_3_DeprecatedBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_3_Deprecated);
    this->d_1_3_Deprecated = pQVar23;
    LOCK();
    pQVar1 = &(pQVar23->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar24 = (QOpenGLFunctions_1_4_DeprecatedBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_1_4_Deprecated);
    this->d_1_4_Deprecated = pQVar24;
    LOCK();
    pQVar1 = &(pQVar24->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar25 = (QOpenGLFunctions_3_3_DeprecatedBackend *)
              QAbstractOpenGLFunctionsPrivate::functionsBackend(context,OpenGL_3_3_Deprecated);
    this->d_3_3_Deprecated = pQVar25;
    LOCK();
    pQVar1 = &(pQVar25->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    QAbstractOpenGLFunctions::initializeOpenGLFunctions(&this->super_QAbstractOpenGLFunctions);
  }
LAB_00171402:
  bVar2 = QAbstractOpenGLFunctions::isInitialized(&this->super_QAbstractOpenGLFunctions);
  return bVar2;
}

Assistant:

bool QOpenGLFunctions_4_3_Compatibility::initializeOpenGLFunctions()
{
    if ( isInitialized() )
        return true;

    QOpenGLContext* context = QOpenGLContext::currentContext();

    // If owned by a context object make sure it is current.
    // Also check that current context is capable of resolving all needed functions
    if (((owningContext() && owningContext() == context) || !owningContext())
        && QOpenGLFunctions_4_3_Compatibility::isContextCompatible(context))
    {
        // Associate with private implementation, creating if necessary
        // Function pointers in the backends are resolved at creation time
        QOpenGLVersionFunctionsBackend* d = nullptr;
        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_0_CoreBackend::versionStatus());
        d_1_0_Core = static_cast<QOpenGLFunctions_1_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_1_CoreBackend::versionStatus());
        d_1_1_Core = static_cast<QOpenGLFunctions_1_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_2_CoreBackend::versionStatus());
        d_1_2_Core = static_cast<QOpenGLFunctions_1_2_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_3_CoreBackend::versionStatus());
        d_1_3_Core = static_cast<QOpenGLFunctions_1_3_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_4_CoreBackend::versionStatus());
        d_1_4_Core = static_cast<QOpenGLFunctions_1_4_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_5_CoreBackend::versionStatus());
        d_1_5_Core = static_cast<QOpenGLFunctions_1_5_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_2_0_CoreBackend::versionStatus());
        d_2_0_Core = static_cast<QOpenGLFunctions_2_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_2_1_CoreBackend::versionStatus());
        d_2_1_Core = static_cast<QOpenGLFunctions_2_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_3_0_CoreBackend::versionStatus());
        d_3_0_Core = static_cast<QOpenGLFunctions_3_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_3_1_CoreBackend::versionStatus());
        d_3_1_Core = static_cast<QOpenGLFunctions_3_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_3_2_CoreBackend::versionStatus());
        d_3_2_Core = static_cast<QOpenGLFunctions_3_2_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_3_3_CoreBackend::versionStatus());
        d_3_3_Core = static_cast<QOpenGLFunctions_3_3_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_4_0_CoreBackend::versionStatus());
        d_4_0_Core = static_cast<QOpenGLFunctions_4_0_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_4_1_CoreBackend::versionStatus());
        d_4_1_Core = static_cast<QOpenGLFunctions_4_1_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_4_2_CoreBackend::versionStatus());
        d_4_2_Core = static_cast<QOpenGLFunctions_4_2_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_4_3_CoreBackend::versionStatus());
        d_4_3_Core = static_cast<QOpenGLFunctions_4_3_CoreBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_0_DeprecatedBackend::versionStatus());
        d_1_0_Deprecated = static_cast<QOpenGLFunctions_1_0_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_1_DeprecatedBackend::versionStatus());
        d_1_1_Deprecated = static_cast<QOpenGLFunctions_1_1_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_2_DeprecatedBackend::versionStatus());
        d_1_2_Deprecated = static_cast<QOpenGLFunctions_1_2_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_3_DeprecatedBackend::versionStatus());
        d_1_3_Deprecated = static_cast<QOpenGLFunctions_1_3_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_1_4_DeprecatedBackend::versionStatus());
        d_1_4_Deprecated = static_cast<QOpenGLFunctions_1_4_DeprecatedBackend*>(d);
        d->refs.ref();

        d = QAbstractOpenGLFunctionsPrivate::functionsBackend(context, QOpenGLFunctions_3_3_DeprecatedBackend::versionStatus());
        d_3_3_Deprecated = static_cast<QOpenGLFunctions_3_3_DeprecatedBackend*>(d);
        d->refs.ref();

        QAbstractOpenGLFunctions::initializeOpenGLFunctions();
    }
    return isInitialized();
}